

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::FieldTypeMethods::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldTypeMethods *this,FieldTypeEnum field_type)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  if (iVar1 == 0x20) {
    __s = "DISCARD";
    __a = &local_d;
  }
  else if (iVar1 == 0x53) {
    __s = "STRING";
    __a = &local_c;
  }
  else if (iVar1 == 0x49) {
    __s = "INTEGER";
    __a = &local_a;
  }
  else if (iVar1 == 0x4c) {
    __s = "LONG";
    __a = &local_b;
  }
  else if (iVar1 == 0x44) {
    __s = "DOUBLE";
    __a = &local_9;
  }
  else {
    __s = "DOUBLE";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldTypeMethods::ToString(FieldTypeEnum field_type)
{
    switch (field_type)
    {
        case FieldTypeEnum::DOUBLE:
            return "DOUBLE";
        case FieldTypeEnum::INTEGER:
            return "INTEGER";
        case FieldTypeEnum::LONG:
            return "LONG";
        case FieldTypeEnum::STRING:
            return "STRING";
        case FieldTypeEnum::DISCARD:
            return "DISCARD";
        default:
            return "DOUBLE";
    }
}